

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O0

int Test_SUNLinSolGetType(SUNLinearSolver S,SUNLinearSolver_Type suntype,int myid)

{
  int iVar1;
  uint in_EDX;
  int in_ESI;
  undefined8 in_RDI;
  double dVar2;
  double dVar3;
  SUNLinearSolver_Type mysuntype;
  double stop_time;
  double start_time;
  int local_4;
  
  dVar2 = get_time();
  iVar1 = SUNLinSolGetType(in_RDI);
  sync_device();
  dVar3 = get_time();
  if (in_ESI == iVar1) {
    if ((in_EDX == 0) && (printf("    PASSED test -- SUNLinSolGetType \n"), print_time != 0)) {
      printf("    SUNLinSolGetType Time: %22.15e \n \n",dVar3 - dVar2);
    }
    local_4 = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolGetType, Proc %d \n",(ulong)in_EDX);
    if (print_time != 0) {
      printf("    SUNLinSolGetType Time: %22.15e \n \n",dVar3 - dVar2);
    }
    local_4 = 1;
  }
  return local_4;
}

Assistant:

int Test_SUNLinSolGetType(SUNLinearSolver S, SUNLinearSolver_Type suntype,
                          int myid)
{
  double start_time, stop_time;
  SUNLinearSolver_Type mysuntype;

  start_time = get_time();
  mysuntype  = SUNLinSolGetType(S);
  sync_device();
  stop_time = get_time();

  if (suntype != mysuntype)
  {
    printf(">>> FAILED test -- SUNLinSolGetType, Proc %d \n", myid);
    PRINT_TIME("    SUNLinSolGetType Time: %22.15e \n \n",
               stop_time - start_time);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolGetType \n");
    PRINT_TIME("    SUNLinSolGetType Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}